

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_writeMessage(qpTestLog *log,char *format,...)

{
  char in_AL;
  deBool dVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined4 local_438;
  undefined4 local_434;
  va_list args;
  char local_418 [8];
  char buffer [1024];
  char *format_local;
  qpTestLog *log_local;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_4e8;
  args[0]._0_8_ = &stack0x00000008;
  local_434 = 0x30;
  local_438 = 0x10;
  buffer[0x3f7] = '\0';
  local_4d8 = in_RDX;
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  buffer._1016_8_ = format;
  vsnprintf(local_418,0x400,format,&local_438);
  printf("%s\n",local_418);
  dVar1 = qpTestLog_writeKeyValuePair
                    (log,"Text",(char *)0x0,(char *)0x0,(char *)0x0,QP_KEY_TAG_LAST,local_418);
  return dVar1;
}

Assistant:

deBool qpTestLog_writeMessage (qpTestLog* log, const char* format, ...)
{
	char	buffer[1024];
	va_list	args;

	/* \todo [petri] Handle buffer overflows! */

	va_start(args, format);
	buffer[DE_LENGTH_OF_ARRAY(buffer) - 1] = 0;
	vsnprintf(buffer, sizeof(buffer), format, args);
	va_end(args);

	printf("%s\n", buffer);

	/* <Text>text</Text> */
	return qpTestLog_writeKeyValuePair(log, "Text", DE_NULL, DE_NULL, DE_NULL, QP_KEY_TAG_LAST, buffer);
}